

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_size(Curl_easy *data,connectdata *conn)

{
  ftp_conn *ftpc;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((data->req).p.file)->fd == 1) && ((conn->proto).ftpc.file != (char *)0x0)) {
    ftp._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
    if (ftp._4_4_ == CURLE_OK) {
      _state(data,FTP_SIZE);
    }
  }
  else {
    ftp._4_4_ = ftp_state_rest(data,conn);
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_size(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer == PPTRANSFER_INFO) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* we know ftpc->file is a valid pointer to a file name */
    result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
    if(!result)
      state(data, FTP_SIZE);
  }
  else
    result = ftp_state_rest(data, conn);

  return result;
}